

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

void free_symtbl(symtbl_t *s)

{
  void *in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    for (uVar1 = 0; uVar1 < *(uint *)((long)in_RDI + 8); uVar1 = uVar1 + 1) {
      free_symtbl((symtbl_t *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
    }
    free(*(void **)((long)in_RDI + 0x18));
  }
  if (*(long *)((long)in_RDI + 0x10) != 0) {
    for (uVar1 = 0; uVar1 < *(uint *)((long)in_RDI + 4); uVar1 = uVar1 + 1) {
      free(*(void **)(*(long *)((long)in_RDI + 0x10) + (ulong)uVar1 * 8));
    }
    free(*(void **)((long)in_RDI + 0x10));
  }
  free(in_RDI);
  return;
}

Assistant:

void free_symtbl(symtbl_t* s)
{
    unsigned int i;
    if (s->children)
    {
        for (i = 0; i < s->num_children; i++)
            free_symtbl(s->children[i]);
        free (s->children);
    }

    if (s->syms)
    {
        for (i = 0; i < s->num_syms; i++)
            free(s->syms[i]);
        free(s->syms);
    }

    free(s);
}